

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::Session::applyCommandLine(Session *this,int argc,char **argv)

{
  bool bVar1;
  IMutableContext *pIVar2;
  ostream *poVar3;
  ostream *this_00;
  char **in_RDI;
  InternalParseResult result;
  BasicResult<Catch::clara::detail::ParseState> *in_stack_fffffffffffffe68;
  Session *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  Session *in_stack_fffffffffffffe80;
  Session *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffecc;
  Args *in_stack_fffffffffffffed0;
  ParserBase *in_stack_fffffffffffffed8;
  Column *in_stack_ffffffffffffff08;
  ostream *in_stack_ffffffffffffff10;
  Colour local_d9;
  undefined1 local_d8 [88];
  BasicResult local_80 [124];
  int local_4;
  
  if (((ulong)in_RDI[0x37] & 1) == 0) {
    clara::detail::Args::Args(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_RDI);
    clara::detail::ParserBase::parse(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    clara::detail::Args::~Args((Args *)in_stack_fffffffffffffe70);
    bVar1 = clara::detail::BasicResult::operator_cast_to_bool(local_80);
    if (bVar1) {
      if ((*(byte *)((long)in_RDI + 0x6f) & 1) != 0) {
        showHelp(in_stack_fffffffffffffe70);
      }
      if ((*(byte *)((long)in_RDI + 0x72) & 1) != 0) {
        libIdentify(in_stack_fffffffffffffea0);
      }
      clara::std::__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2> *)
                 in_stack_fffffffffffffe80);
      local_4 = 0;
    }
    else {
      config(in_stack_fffffffffffffe80);
      pIVar2 = getCurrentMutableContext();
      std::shared_ptr<Catch::IConfig_const>::shared_ptr<Catch::Config,void>
                ((shared_ptr<const_Catch::IConfig> *)in_stack_fffffffffffffe70,
                 (shared_ptr<Catch::Config> *)in_stack_fffffffffffffe68);
      (*(pIVar2->super_IContext)._vptr_IContext[7])(pIVar2,local_d8);
      clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr
                ((shared_ptr<const_Catch::IConfig> *)0x141bd2);
      poVar3 = cerr();
      Colour::Colour((Colour *)in_stack_fffffffffffffe70,
                     (Code)((ulong)in_stack_fffffffffffffe68 >> 0x20));
      poVar3 = Catch::operator<<(poVar3,&local_d9);
      std::operator<<((ostream *)poVar3,"\nError(s) in input:\n");
      clara::detail::BasicResult<Catch::clara::detail::ParseState>::errorMessage_abi_cxx11_
                (in_stack_fffffffffffffe68);
      clara::TextFlow::Column::Column((Column *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78)
      ;
      clara::TextFlow::Column::indent((Column *)&stack0xfffffffffffffef0,2);
      poVar3 = clara::TextFlow::operator<<(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::operator<<((ostream *)poVar3,"\n\n");
      clara::TextFlow::Column::~Column((Column *)0x141c91);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
      Colour::~Colour((Colour *)0x141ca8);
      in_stack_fffffffffffffe70 = (Session *)cerr();
      this_00 = std::operator<<((ostream *)in_stack_fffffffffffffe70,"Run with -? for usage\n");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      local_4 = 0xff;
    }
    clara::detail::BasicResult<Catch::clara::detail::ParseState>::~BasicResult
              ((BasicResult<Catch::clara::detail::ParseState> *)in_stack_fffffffffffffe70);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Session::applyCommandLine( int argc, char const * const * argv ) {
        if( m_startupExceptions )
            return 1;

        auto result = m_cli.parse( clara::Args( argc, argv ) );
        if( !result ) {
            config();
            getCurrentMutableContext().setConfig(m_config);
            Catch::cerr()
                << Colour( Colour::Red )
                << "\nError(s) in input:\n"
                << Column( result.errorMessage() ).indent( 2 )
                << "\n\n";
            Catch::cerr() << "Run with -? for usage\n" << std::endl;
            return MaxExitCode;
        }

        if( m_configData.showHelp )
            showHelp();
        if( m_configData.libIdentify )
            libIdentify();
        m_config.reset();
        return 0;
    }